

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_tone_portamento(xm_context_t *ctx,xm_channel_context_t *ch)

{
  long in_RSI;
  long in_RDI;
  xm_channel_context_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  float local_14;
  
  if (((*(float *)(in_RSI + 100) != 0.0) || (NAN(*(float *)(in_RSI + 100)))) &&
     ((*(float *)(in_RSI + 0x24) != *(float *)(in_RSI + 100) ||
      (NAN(*(float *)(in_RSI + 0x24)) || NAN(*(float *)(in_RSI + 100)))))) {
    if (*(float *)(in_RSI + 0x24) < *(float *)(in_RSI + 100) ||
        *(float *)(in_RSI + 0x24) == *(float *)(in_RSI + 100)) {
      if (*(float *)(in_RSI + 0x24) < *(float *)(in_RSI + 100)) {
        in_stack_ffffffffffffffe0 = 0x3f800000;
        in_stack_ffffffffffffffe4 = 4.0;
        if (*(int *)(in_RDI + 0x14) != 0) {
          in_stack_ffffffffffffffe4 = 1.0;
        }
        *(float *)(in_RSI + 0x24) =
             in_stack_ffffffffffffffe4 * (float)*(byte *)(in_RSI + 0x60) + *(float *)(in_RSI + 0x24)
        ;
        if (*(float *)(in_RSI + 100) <= *(float *)(in_RSI + 0x24) &&
            *(float *)(in_RSI + 0x24) != *(float *)(in_RSI + 100)) {
          *(undefined4 *)(in_RSI + 0x24) = *(undefined4 *)(in_RSI + 100);
        }
      }
    }
    else {
      local_14 = 4.0;
      if (*(int *)(in_RDI + 0x14) != 0) {
        local_14 = 1.0;
      }
      *(float *)(in_RSI + 0x24) =
           -local_14 * (float)*(byte *)(in_RSI + 0x60) + *(float *)(in_RSI + 0x24);
      if (*(float *)(in_RSI + 0x24) < *(float *)(in_RSI + 100)) {
        *(undefined4 *)(in_RSI + 0x24) = *(undefined4 *)(in_RSI + 100);
      }
    }
    xm_update_frequency((xm_context_t *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void xm_tone_portamento(xm_context_t* ctx, xm_channel_context_t* ch) {
	/* 3xx called without a note, wait until we get an actual
	 * target note. */
	if(ch->tone_portamento_target_period == 0.f) return;

	if(ch->period != ch->tone_portamento_target_period) {
		XM_SLIDE_TOWARDS(ch->period,
		                 ch->tone_portamento_target_period,
		                 (ctx->module.frequency_type == XM_LINEAR_FREQUENCIES ?
		                  4.f : 1.f) * ch->tone_portamento_param
		);
		xm_update_frequency(ctx, ch);
	}
}